

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O0

void __thiscall
icu_63::StringCharacterIterator::StringCharacterIterator
          (StringCharacterIterator *this,UnicodeString *textStr,int32_t textPos)

{
  int32_t length;
  char16_t *pcVar1;
  ConstChar16Ptr local_28;
  int32_t local_1c;
  UnicodeString *pUStack_18;
  int32_t textPos_local;
  UnicodeString *textStr_local;
  StringCharacterIterator *this_local;
  
  local_1c = textPos;
  pUStack_18 = textStr;
  textStr_local = (UnicodeString *)this;
  pcVar1 = icu_63::UnicodeString::getBuffer(textStr);
  ConstChar16Ptr::ConstChar16Ptr(&local_28,pcVar1);
  length = icu_63::UnicodeString::length(pUStack_18);
  UCharCharacterIterator::UCharCharacterIterator
            (&this->super_UCharCharacterIterator,&local_28,length,local_1c);
  ConstChar16Ptr::~ConstChar16Ptr(&local_28);
  (this->super_UCharCharacterIterator).super_CharacterIterator.super_ForwardCharacterIterator.
  super_UObject._vptr_UObject = (_func_int **)&PTR__StringCharacterIterator_005c1af0;
  icu_63::UnicodeString::UnicodeString(&this->text,pUStack_18);
  pcVar1 = icu_63::UnicodeString::getBuffer(&this->text);
  (this->super_UCharCharacterIterator).text = pcVar1;
  return;
}

Assistant:

StringCharacterIterator::StringCharacterIterator(const UnicodeString& textStr,
                                                 int32_t textPos)
  : UCharCharacterIterator(textStr.getBuffer(), textStr.length(), textPos),
    text(textStr)
{
    // we had set the input parameter's array, now we need to set our copy's array
    UCharCharacterIterator::text = this->text.getBuffer();
}